

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::ThriftSender_testExceptions_Test::TestBody(ThriftSender_testExceptions_Test *this)

{
  bool bVar1;
  byte bVar2;
  AssertHelper local_498 [8];
  Message local_490 [16];
  Exception *anon_var_0;
  char *pcStack_478;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  string local_468;
  IPAddress local_448;
  undefined1 local_3c0 [8];
  MockThriftSender mockSender;
  ExceptionType type;
  ExceptionType *__end1;
  ExceptionType *__begin1;
  ExceptionType (*__range1) [3];
  ExceptionType exceptionTypes [3];
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> local_2e8;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_2c8;
  time_point local_2a8;
  time_point local_2a0;
  allocator local_291;
  string local_290;
  SpanContext local_260;
  Span local_1b0 [8];
  Span span;
  shared_ptr<opentracing::v3::Tracer> local_40;
  undefined1 local_30 [8];
  shared_ptr<const_jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  ThriftSender_testExceptions_Test *this_local;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer_const,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)local_30);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr(&local_40);
  SpanContext::SpanContext(&local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_290,"",&local_291);
  local_2a0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_2a8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_2c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector(&local_2c8);
  local_2e8.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::vector
            (&local_2e8);
  Span::Span(local_1b0,(shared_ptr<const_jaegertracing::Tracer> *)local_30,&local_260,&local_290,
             &local_2a0,&local_2a8,&local_2c8,&local_2e8);
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
            (&local_2e8);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_2c8);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  SpanContext::~SpanContext(&local_260);
  opentracing::v3::string_view::string_view((string_view *)(exceptionTypes + 1),"test");
  Span::SetOperationName(local_1b0,stack0xfffffffffffffd08);
  stack0xfffffffffffffcfc = 0x100000000;
  exceptionTypes[0] = kString;
  for (__end1 = (ExceptionType *)((long)&__range1 + 4); __end1 != exceptionTypes + 1;
      __end1 = __end1 + 1) {
    mockSender._148_4_ = *__end1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_468,"localhost",(allocator *)((long)&gtest_msg.value + 7));
    net::IPAddress::v4(&local_448,&local_468,0);
    anon_unknown_2::MockThriftSender::MockThriftSender
              ((MockThriftSender *)local_3c0,&local_448,0,mockSender._148_4_);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
    jaegertracing::ThriftSender::append((Span *)local_3c0);
    testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffb88,"");
    bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                      ((ConstCharPtr *)&stack0xfffffffffffffb88);
    if (bVar1) {
      anon_var_0._7_1_ = 0;
      bVar2 = testing::internal::AlwaysTrue();
      if ((bVar2 & 1) != 0) {
        jaegertracing::ThriftSender::flush();
      }
      if ((anon_var_0._7_1_ & 1) == 0) {
        pcStack_478 = 
        "Expected: mockSender.flush() throws an exception of type Sender::Exception.\n  Actual: it throws nothing."
        ;
        goto LAB_002a38f5;
      }
      anon_var_0._0_4_ = 0;
    }
    else {
LAB_002a38f5:
      testing::Message::Message(local_490);
      testing::internal::AssertHelper::AssertHelper
                (local_498,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ThriftSenderTest.cpp"
                 ,0x69,pcStack_478);
      testing::internal::AssertHelper::operator=(local_498,local_490);
      testing::internal::AssertHelper::~AssertHelper(local_498);
      testing::Message::~Message(local_490);
      anon_var_0._0_4_ = 1;
    }
    anon_unknown_2::MockThriftSender::~MockThriftSender((MockThriftSender *)local_3c0);
    if ((int)anon_var_0 != 0) goto LAB_002a39f5;
  }
  anon_var_0._0_4_ = 0;
LAB_002a39f5:
  Span::~Span(local_1b0);
  std::shared_ptr<const_jaegertracing::Tracer>::~shared_ptr
            ((shared_ptr<const_jaegertracing::Tracer> *)local_30);
  std::shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>::~shared_ptr
            ((shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> *)
             &tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(ThriftSender, testExceptions)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<const Tracer>(opentracing::Tracer::Global());

    Span span(tracer);
    span.SetOperationName("test");

    const MockUDPSender::ExceptionType exceptionTypes[] = {
        MockUDPSender::ExceptionType::kSystemError,
        MockUDPSender::ExceptionType::kException,
        MockUDPSender::ExceptionType::kString
    };
    for (auto type : exceptionTypes) {
      MockThriftSender mockSender(net::IPAddress::v4("localhost", 0), 0, type);
      mockSender.append(span);
        ASSERT_THROW(mockSender.flush(), Sender::Exception);
    }
}